

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::SharedMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  int iVar1;
  element_type *peVar2;
  recursive_mutex *__mutex;
  Impl *pIVar3;
  bool bVar4;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  pIVar3 = this->m_pImpl;
  if (mesh_type == render_mesh) {
    if (pIVar3 == (Impl *)0x0) {
      pIVar3 = (Impl *)0x0;
      goto LAB_003e7642;
    }
LAB_003e7633:
    peVar2 = (pIVar3->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar2 == (element_type *)0x0) goto LAB_003e7642;
  }
  else {
    if (mesh_type == preview_mesh) {
LAB_003e762f:
      pIVar3 = (Impl *)&pIVar3->m_preview_mesh;
      goto LAB_003e7633;
    }
    if (mesh_type == analysis_mesh) {
      pIVar3 = (Impl *)&pIVar3->m_analysis_mesh;
      goto LAB_003e7633;
    }
    bVar4 = (pIVar3->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0;
    peVar2 = (&(pIVar3->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
             )[bVar4]._M_ptr;
    if (peVar2 == (element_type *)0x0) goto LAB_003e762f;
    pIVar3 = (Impl *)(&(pIVar3->m_render_mesh).
                       super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> + bVar4);
  }
  peVar2->m_parent = (ON_Object *)this;
LAB_003e7642:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return &pIVar3->m_render_mesh;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::SharedMesh(ON::mesh_type mesh_type) const
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  std::shared_ptr<const ON_Mesh>* pMesh = nullptr;

  switch (mesh_type)
  {
  case ON::render_mesh:
    pMesh = &m_pImpl->m_render_mesh;
    break;
  case ON::analysis_mesh:
    pMesh = &m_pImpl->m_analysis_mesh;
    break;
  case ON::preview_mesh:
    pMesh = &m_pImpl->m_preview_mesh;
    break;
  default:
    pMesh = m_pImpl->m_render_mesh ? &m_pImpl->m_render_mesh : &m_pImpl->m_analysis_mesh;
    if (pMesh->get() == nullptr)
    {
      pMesh = &m_pImpl->m_preview_mesh;
    }
    break;
  }

  if (pMesh && pMesh->get())
  {
    const_cast<ON_Mesh*>(pMesh->get())->m_parent = this;
  }

  return *pMesh;
}